

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O1

void __thiscall
slang::ast::Expression::visit<(anonymous_namespace)::HierarchicalVisitor&>
          (Expression *this,HierarchicalVisitor *visitor)

{
  undefined8 *puVar1;
  __index_type _Var2;
  long lVar3;
  Symbol *pSVar4;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar5;
  variant_alternative_t<1UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar6;
  SyntaxNode *pSVar7;
  DeclaredType *this_00;
  Expression *pEVar8;
  variant_alternative_t<2UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar9;
  logic_error *plVar10;
  long *plVar11;
  size_type *psVar12;
  long *plVar13;
  HierarchicalVisitor *visitor_00;
  long lVar14;
  long lVar15;
  StreamExpression *stream;
  SyntaxNode *pSVar16;
  SyntaxNode *pSVar17;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  visitor_00 = visitor;
  do {
    switch((((Type *)this)->super_Symbol).kind) {
    case Unknown:
    case Root:
    case CompilationUnit:
    case DeferredMember:
    case TransparentMember:
    case EmptyMember:
    case PredefinedIntegerType:
    case ScalarType:
    case FloatingType:
    case ClassType:
    case NullType:
    case CHandleType:
    case StringType:
    case EventType:
    case SequenceType:
      goto switchD_0024e63a_caseD_0;
    case EnumType:
      visitor->any = true;
      return;
    case FixedSizeUnpackedArrayType:
      pSVar17 = *(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38);
      if (pSVar17 != (SyntaxNode *)0x0) {
        lVar3 = *(long *)((long)&((Type *)this)->super_Symbol + 0x30);
        lVar14 = 0;
        do {
          pEVar8 = *(Expression **)(lVar3 + lVar14);
          if (pEVar8 == (Expression *)0x0) goto LAB_0024ea40;
          visit<(anonymous_namespace)::HierarchicalVisitor&>(pEVar8,visitor);
          lVar14 = lVar14 + 0x10;
        } while ((long)pSVar17 << 4 != lVar14);
      }
    case AssociativeArrayType:
      visitor_00 = visitor;
      visit<(anonymous_namespace)::HierarchicalVisitor&>
                ((Expression *)((Type *)this)->canonical,visitor);
      this = *(Expression **)((long)this + 0x48);
      break;
    case DynamicArrayType:
      visit<(anonymous_namespace)::HierarchicalVisitor&>
                (*(Expression **)((long)&((Type *)this)->super_Symbol + 0x30),visitor);
      lVar3 = (long)((Type *)this)->canonical;
      if (lVar3 == 0) {
        return;
      }
      pSVar17 = *(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38);
      lVar14 = 0;
      do {
        visit<(anonymous_namespace)::HierarchicalVisitor&>
                  (*(Expression **)((long)&pSVar17->parent + lVar14),visitor);
        lVar14 = lVar14 + 8;
      } while (lVar3 << 3 != lVar14);
      return;
    case QueueType:
      pSVar17 = *(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38);
      if (pSVar17 == (SyntaxNode *)0x0) {
        return;
      }
      lVar3 = *(long *)((long)&((Type *)this)->super_Symbol + 0x30);
      lVar14 = 0;
      do {
        visit<(anonymous_namespace)::HierarchicalVisitor&>(*(Expression **)(lVar3 + lVar14),visitor)
        ;
        lVar14 = lVar14 + 8;
      } while ((long)pSVar17 << 3 != lVar14);
      return;
    case PackedStructType:
    case PackedUnionType:
    case PropertyType:
      visitor_00 = visitor;
      visit<(anonymous_namespace)::HierarchicalVisitor&>
                (*(Expression **)((long)&((Type *)this)->super_Symbol + 0x30),visitor);
    case EnumValue:
    case VoidType:
      this = (Expression *)(((Expression *)((long)&((Type *)this)->super_Symbol + 0x30))->type).ptr;
      break;
    case UnpackedStructType:
      if (((Type *)this)->canonical == (Type *)0x0) {
        return;
      }
      pSVar17 = *(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38);
      puVar1 = (undefined8 *)((long)pSVar17 + (long)((Type *)this)->canonical * 0x18);
      while ((Expression *)pSVar17->parent != (Expression *)0x0) {
        visit<(anonymous_namespace)::HierarchicalVisitor&>((Expression *)pSVar17->parent,visitor);
        if (*(Expression **)&pSVar17->kind != (Expression *)0x0) {
          visit<(anonymous_namespace)::HierarchicalVisitor&>(*(Expression **)&pSVar17->kind,visitor)
          ;
        }
        pSVar17 = (SyntaxNode *)((long)(pSVar17 + 1) + 8);
        if (pSVar17 == (SyntaxNode *)puVar1) {
          return;
        }
      }
LAB_0024ea40:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<const slang::ast::Expression *>::get() const [T = const slang::ast::Expression *]"
                );
    case UnpackedUnionType:
      visit<(anonymous_namespace)::HierarchicalVisitor&>
                (*(Expression **)((long)&((Type *)this)->super_Symbol + 0x30),visitor);
    case PackedArrayType:
      visitor_00 = visitor;
      visit<(anonymous_namespace)::HierarchicalVisitor&>
                (*(Expression **)((long)&((Type *)this)->super_Symbol + 0x38),visitor);
      this = (Expression *)((Type *)this)->canonical;
      break;
    case CovergroupType:
      if (*(Scope **)((long)this + 0x48U + 0x20) != (Scope *)0x0) {
        visitor_00 = visitor;
        visit<(anonymous_namespace)::HierarchicalVisitor&>
                  ((Expression *)*(Scope **)((long)this + 0x48U + 0x20),visitor);
      }
      if (*(char *)((long)this + 0x48U + 0x18) == '\x01') {
        pvVar5 = std::
                 get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                           ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             *)((long)&((Type *)this)->super_Symbol + 0x30));
        _Var2 = *(__index_type *)
                 ((long)&(pvVar5->extraInfo).
                         super__Variant_base<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                         .
                         super__Move_assign_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                         .
                         super__Copy_assign_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                         .
                         super__Move_ctor_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                         .
                         super__Copy_ctor_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                         .
                         super__Variant_storage_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                 + 0x18);
        if (_Var2 == '\x02') {
          pvVar9 = std::
                   get<2ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                             (&pvVar5->extraInfo);
          if (pvVar9->inlineConstraints != (Constraint *)0x0) {
            Constraint::visit<(anonymous_namespace)::HierarchicalVisitor>
                      (pvVar9->inlineConstraints,visitor_00);
          }
        }
        else if (_Var2 == '\x01') {
          pvVar6 = std::
                   get<1ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                             (&pvVar5->extraInfo);
          if (pvVar6->iterExpr != (Expression *)0x0) {
            visit<(anonymous_namespace)::HierarchicalVisitor&>(pvVar6->iterExpr,visitor);
          }
        }
      }
      lVar3 = *(long *)((long)this + 0x48U + 0x30);
      if (lVar3 == 0) {
        return;
      }
      pSVar4 = *(Symbol **)((long)this + 0x48U + 0x28);
      lVar14 = 0;
      do {
        visit<(anonymous_namespace)::HierarchicalVisitor&>
                  (*(Expression **)((long)&pSVar4->kind + lVar14),visitor);
        lVar14 = lVar14 + 8;
      } while (lVar3 << 3 != lVar14);
      return;
    case UnboundedType:
      pSVar17 = *(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38);
      if (pSVar17 == (SyntaxNode *)0x0) {
        return;
      }
      lVar3 = *(long *)((long)&((Type *)this)->super_Symbol + 0x30);
      lVar14 = 0;
      do {
        visit<(anonymous_namespace)::HierarchicalVisitor&>(*(Expression **)(lVar3 + lVar14),visitor)
        ;
        lVar14 = lVar14 + 8;
      } while ((long)pSVar17 << 3 != lVar14);
      return;
    case TypeRefType:
      pSVar17 = *(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38);
      if (pSVar17 == (SyntaxNode *)0x0) {
        return;
      }
      lVar3 = *(long *)((long)&((Type *)this)->super_Symbol + 0x30);
      lVar14 = 0;
      do {
        visit<(anonymous_namespace)::HierarchicalVisitor&>(*(Expression **)(lVar3 + lVar14),visitor)
        ;
        lVar14 = lVar14 + 8;
      } while ((long)pSVar17 << 3 != lVar14);
      return;
    case UntypedType:
      visit<(anonymous_namespace)::HierarchicalVisitor&>
                ((Expression *)((Type *)this)->canonical,visitor);
      pSVar17 = *(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38);
      if (pSVar17 == (SyntaxNode *)0x0) {
        return;
      }
      lVar3 = *(long *)((long)&((Type *)this)->super_Symbol + 0x30);
      lVar14 = 0;
      do {
        visit<(anonymous_namespace)::HierarchicalVisitor&>(*(Expression **)(lVar3 + lVar14),visitor)
        ;
        lVar14 = lVar14 + 8;
      } while ((long)pSVar17 << 3 != lVar14);
      return;
    case VirtualInterfaceType:
      visit<(anonymous_namespace)::HierarchicalVisitor&>
                (*(Expression **)((long)&((Type *)this)->super_Symbol + 0x30),visitor);
      lVar3 = (long)((Type *)this)->canonical;
      if (lVar3 == 0) {
        return;
      }
      pSVar17 = *(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38);
      pSVar16 = pSVar17 + 1;
      do {
        visit<(anonymous_namespace)::HierarchicalVisitor&>
                  ((Expression *)pSVar16[0xffffffffffffffff].parent,visitor);
        if ((char)pSVar16->kind == SyntaxList) {
          visit<(anonymous_namespace)::HierarchicalVisitor&>((Expression *)pSVar16->parent,visitor);
        }
        pSVar7 = pSVar16 + 1;
        pSVar16 = pSVar16 + 2;
      } while (pSVar7 != pSVar17 + lVar3 * 2);
      return;
    case TypeAlias:
      visitor_00 = visitor;
      visit<(anonymous_namespace)::HierarchicalVisitor&>
                (*(Expression **)((long)&((Type *)this)->super_Symbol + 0x30),visitor);
    case ErrorType:
    case MultiPort:
      this = *(Expression **)((long)&((Type *)this)->super_Symbol + 0x38);
      if ((Type *)this == (Type *)0x0) {
switchD_0024e63a_caseD_0:
        return;
      }
      break;
    case ForwardingTypedef:
      pSVar17 = *(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38);
      if (pSVar17 == (SyntaxNode *)0x0) {
        return;
      }
      lVar3 = *(long *)((long)&((Type *)this)->super_Symbol + 0x30);
      lVar14 = 0;
      do {
        visit<(anonymous_namespace)::HierarchicalVisitor&>(*(Expression **)(lVar3 + lVar14),visitor)
        ;
        lVar14 = lVar14 + 8;
      } while ((long)pSVar17 << 3 != lVar14);
      return;
    case NetType:
    case Parameter:
      this = *(Expression **)((long)&((Type *)this)->super_Symbol + 0x30);
      break;
    case TypeParameter:
      if (**(uint **)((long)&((Type *)this)->super_Symbol + 0x30) < 10) {
        return;
      }
      plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
                 ,"");
      plVar11 = (long *)std::__cxx11::string::append((char *)local_90);
      local_d0._M_dataplus._M_p = (pointer)*plVar11;
      psVar12 = (size_type *)(plVar11 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar12) {
        local_d0.field_2._M_allocated_capacity = *psVar12;
        local_d0.field_2._8_8_ = plVar11[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar12;
      }
      local_d0._M_string_length = plVar11[1];
      *plVar11 = (long)psVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x123);
      std::operator+(&local_50,&local_d0,&local_70);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b0 = (long *)*plVar11;
      plVar13 = plVar11 + 2;
      if (local_b0 == plVar13) {
        local_a0 = *plVar13;
        lStack_98 = plVar11[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar13;
      }
      local_a8 = plVar11[1];
      *plVar11 = (long)plVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_f0 = (long *)*plVar11;
      plVar13 = plVar11 + 2;
      if (local_f0 == plVar13) {
        local_e0 = *plVar13;
        lStack_d8 = plVar11[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar13;
      }
      local_e8 = plVar11[1];
      *plVar11 = (long)plVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::logic_error::logic_error(plVar10,(string *)&local_f0);
      __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    case Port:
      if (0xc < *(uint *)&(*(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38))->parent) {
        plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_90,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
                   ,"");
        plVar11 = (long *)std::__cxx11::string::append((char *)local_90);
        local_d0._M_dataplus._M_p = (pointer)*plVar11;
        psVar12 = (size_type *)(plVar11 + 2);
        if ((size_type *)local_d0._M_dataplus._M_p == psVar12) {
          local_d0.field_2._M_allocated_capacity = *psVar12;
          local_d0.field_2._8_8_ = plVar11[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar12;
        }
        local_d0._M_string_length = plVar11[1];
        *plVar11 = (long)psVar12;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::to_string(&local_70,0x199);
        std::operator+(&local_50,&local_d0,&local_70);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_b0 = (long *)*plVar11;
        plVar13 = plVar11 + 2;
        if (local_b0 == plVar13) {
          local_a0 = *plVar13;
          lStack_98 = plVar11[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar13;
        }
        local_a8 = plVar11[1];
        *plVar11 = (long)plVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_f0 = (long *)*plVar11;
        plVar13 = plVar11 + 2;
        if (local_f0 == plVar13) {
          local_e0 = *plVar13;
          lStack_d8 = plVar11[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *plVar13;
        }
        local_e8 = plVar11[1];
        *plVar11 = (long)plVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::logic_error::logic_error(plVar10,(string *)&local_f0);
        __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      lVar3 = *(long *)((long)this + 0x48U + 0x10);
      if (lVar3 == 0) {
        return;
      }
      lVar14 = *(long *)((long)this + 0x48U + 8);
      lVar15 = 0;
      do {
        this_00 = Symbol::getDeclaredType(*(Symbol **)(lVar14 + lVar15));
        if (this_00 == (DeclaredType *)0x0) {
          assert::assertFailed
                    ("dt",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/expressions/MiscExpressions.h"
                     ,0xe4,
                     "void slang::ast::AssertionInstanceExpression::visitExprs(TVisitor &&) const [TVisitor = (anonymous namespace)::HierarchicalVisitor &]"
                    );
        }
        pEVar8 = DeclaredType::getInitializer(this_00);
        if (pEVar8 != (Expression *)0x0) {
          visit<(anonymous_namespace)::HierarchicalVisitor&>(pEVar8,visitor);
        }
        lVar15 = lVar15 + 8;
      } while (lVar3 << 3 != lVar15);
      return;
    default:
      plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
                 ,"");
      plVar11 = (long *)std::__cxx11::string::append((char *)local_90);
      local_d0._M_dataplus._M_p = (pointer)*plVar11;
      psVar12 = (size_type *)(plVar11 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar12) {
        local_d0.field_2._M_allocated_capacity = *psVar12;
        local_d0.field_2._8_8_ = plVar11[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar12;
      }
      local_d0._M_string_length = plVar11[1];
      *plVar11 = (long)psVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x15b);
      std::operator+(&local_50,&local_d0,&local_70);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b0 = (long *)*plVar11;
      plVar13 = plVar11 + 2;
      if (local_b0 == plVar13) {
        local_a0 = *plVar13;
        lStack_98 = plVar11[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar13;
      }
      local_a8 = plVar11[1];
      *plVar11 = (long)plVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_f0 = (long *)*plVar11;
      plVar13 = plVar11 + 2;
      if (local_f0 == plVar13) {
        local_e0 = *plVar13;
        lStack_d8 = plVar11[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar13;
      }
      local_e8 = plVar11[1];
      *plVar11 = (long)plVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::logic_error::logic_error(plVar10,(string *)&local_f0);
      __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  } while( true );
}

Assistant:

decltype(auto) Expression::visit(TVisitor&& visitor, Args&&... args) const {
    return visitExpression(this, visitor, std::forward<Args>(args)...);
}